

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_debug.c
# Opt level: O1

int jas_memdump(FILE *out,void *data,size_t len)

{
  ulong uVar1;
  uchar *dp;
  long lVar2;
  ulong uVar3;
  
  if (len != 0) {
    uVar3 = 0;
    do {
      fprintf((FILE *)out,"%04zx:",uVar3);
      lVar2 = 0x10;
      uVar1 = uVar3;
      do {
        if (uVar1 < len) {
          fprintf((FILE *)out," %02x",(ulong)*(byte *)((long)data + uVar1));
        }
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      fputc(10,(FILE *)out);
      uVar3 = uVar3 + 0x10;
    } while (uVar3 < len);
  }
  return 0;
}

Assistant:

int jas_memdump(FILE *out, void *data, size_t len)
{
	size_t i;
	size_t j;
	jas_uchar *dp;
	dp = data;
	for (i = 0; i < len; i += 16) {
		fprintf(out, "%04zx:", i);
		for (j = 0; j < 16; ++j) {
			if (i + j < len) {
				fprintf(out, " %02x", dp[i + j]);
			}
		}
		fprintf(out, "\n");
	}
	return 0;
}